

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  int i;
  cpp_dec_float<100U,_int,_void> *this;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  char name [16];
  cpp_dec_float<100U,_int,_void> local_e8;
  cpp_dec_float<100U,_int,_void> local_98;
  char local_48 [24];
  
  if (0 < (p_lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    i = 0;
    iVar5 = 0;
    do {
      this = &local_98;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)this,p_svec,i);
      if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_0013f609:
        if (iVar5 == 0) {
          poVar4 = boost::multiprecision::operator<<
                             (p_output,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)this);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar2 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)(p_lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thekey,i,p_cnames,local_48);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
          }
        }
        else {
          if (iVar5 * -0x33333333 + 0x19999999U < 0x33333333) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
          }
          if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_0013f665:
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_e8,0,(type *)0x0);
            iVar1 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (this,&local_e8);
            if (-1 < iVar1) goto LAB_0013f665;
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            local_e8.neg = local_98.neg;
            local_e8.data._M_elems[0] = local_98.data._M_elems[0];
            if (local_98.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) {
              local_e8.neg = (bool)(local_98.neg ^ 1);
            }
            this = &local_e8;
          }
          boost::multiprecision::operator<<
                    (p_output,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)this);
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          pcVar2 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)(p_lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thekey,i,p_cnames,local_48);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)p_output + (int)*(undefined8 *)(*(long *)p_output + -0x18));
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar2,sVar3);
          }
        }
        iVar5 = iVar5 + 1;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_e8,0,(type *)0x0);
        iVar1 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (this,&local_e8);
        if (writeZeroCoefficients || iVar1 != 0) goto LAB_0013f609;
      }
      i = i + 1;
    } while (i < (p_lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}